

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_type.hpp
# Opt level: O2

void __thiscall duckdb::Blob::ToBase64(Blob *this,string_t blob,char *output)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  string_t blob_local;
  
  blob_local.value.pointer.ptr = blob.value._0_8_;
  pcVar4 = blob.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar4 = blob_local.value.pointer.prefix;
  }
  uVar5 = (ulong)this & 0xffffffff;
  pcVar3 = (char *)(blob.value._8_8_ + 3);
  for (uVar2 = 0; uVar2 + 2 < uVar5; uVar2 = uVar2 + 3) {
    pcVar3[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(byte)pcVar4[uVar2] >> 2];
    pcVar3[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(uint)((byte)pcVar4[uVar2 + 1] >> 4) | ((byte)pcVar4[uVar2] & 3) << 4];
    pcVar3[-1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(uint)((byte)pcVar4[uVar2 + 2] >> 6) + ((byte)pcVar4[uVar2 + 1] & 0xf) * 4];
    *pcVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(byte)pcVar4[uVar2 + 2] & 0x3f];
    pcVar3 = pcVar3 + 4;
  }
  if (uVar2 < uVar5) {
    pcVar3[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(byte)pcVar4[uVar2] >> 2];
    uVar6 = ((byte)pcVar4[uVar2] & 3) << 4;
    if (uVar5 - 1 == uVar2) {
      pcVar3[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar6];
      cVar1 = '=';
    }
    else {
      pcVar3[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(byte)((byte)uVar6 | (byte)pcVar4[uVar2 + 1] >> 4)];
      cVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(ulong)((byte)pcVar4[uVar2 + 1] & 0xf) * 4];
    }
    pcVar3[-1] = cVar1;
    *pcVar3 = '=';
  }
  return;
}

Assistant:

const char *GetData() const {
		return IsInlined() ? const_char_ptr_cast(value.inlined.inlined) : value.pointer.ptr;
	}